

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::Operation::Clear(Operation *this)

{
  uint32_t cached_has_bits;
  Operation *this_local;
  
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::Clear(&this->inputs_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::Clear
            (&this->outputs_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Block>::Clear(&this->blocks_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::Clear(&this->attributes_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->type_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Operation::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Operation)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  inputs_.Clear();
  outputs_.Clear();
  blocks_.Clear();
  attributes_.Clear();
  type_.ClearToEmpty();
  _internal_metadata_.Clear<std::string>();
}